

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::SupportsPresenceApi(FieldDescriptor *descriptor)

{
  Type TVar1;
  FieldDescriptor *descriptor_local;
  
  TVar1 = FieldDescriptor::type(descriptor);
  if (TVar1 == TYPE_MESSAGE) {
    descriptor_local._7_1_ = false;
  }
  else {
    descriptor_local._7_1_ = FieldDescriptor::has_presence(descriptor);
  }
  return descriptor_local._7_1_;
}

Assistant:

inline bool SupportsPresenceApi(const FieldDescriptor* descriptor) {
  // Unlike most languages, we don't generate Has/Clear members for message
  // types, because they can always be set to null in C#. They're not really
  // needed for oneof fields in proto2 either, as everything can be done via
  // oneof case, but we follow the convention from other languages.
  if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE) {
    return false;
  }

  return descriptor->has_presence();
}